

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamePattern.cpp
# Opt level: O3

double Tld_Dga_Eval_T_A(size_t len,uint8_t *val)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  size_t count [4];
  long local_38 [4];
  
  local_38[2] = 0;
  local_38[3] = 0;
  local_38[0] = 0;
  local_38[1] = 0;
  if (len != 0) {
    sVar2 = 0;
    bVar3 = 2;
    do {
      bVar1 = *(byte *)((long)char_proba + (ulong)val[sVar2] + 0xc6);
      if (bVar3 < 2) {
        local_38[(uint)bVar1 + (uint)bVar3 * 2] = local_38[(uint)bVar1 + (uint)bVar3 * 2] + 1;
      }
      sVar2 = sVar2 + 1;
      bVar3 = bVar1;
    } while (len != sVar2);
  }
  auVar6._8_4_ = (int)(len >> 0x20);
  auVar6._0_8_ = len;
  auVar6._12_4_ = 0x45300000;
  dVar9 = 0.0;
  lVar4 = 0;
  do {
    auVar7._0_8_ = (double)CONCAT44(0x43300000,(int)*(undefined8 *)((long)local_38 + lVar4));
    auVar7._8_4_ = (int)((ulong)*(undefined8 *)((long)local_38 + lVar4) >> 0x20);
    auVar7._12_4_ = 0x45300000;
    dVar8 = ((auVar7._8_8_ - 1.9342813113834067e+25) + (auVar7._0_8_ - 4503599627370496.0) +
            *(double *)((long)transition_group_weight + lVar4)) /
            ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)len) - 4503599627370496.0));
    dVar5 = log(dVar8 / *(double *)((long)transition_group_proba + lVar4));
    dVar9 = dVar9 + dVar5 * dVar8;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  return dVar9;
}

Assistant:

static double Tld_Dga_Eval_T_A(size_t len, uint8_t * val)
{
    size_t count[4];
    double klt = 0;
    uint8_t previous_group = 2;

    memset(count, 0, sizeof(count));

    for (size_t i = 0; i<len; i++)
    {
        uint8_t t_group_index = transition_group[val[i] - 10];

        if (previous_group < 2)
        {
            count[2 * previous_group + t_group_index] ++;
        }
        previous_group = t_group_index;
    }

    for (int j = 0; j < 4; j++)
    {
        double p = ((double)count[j] + (double)transition_group_weight[j]) / ((double)(len));
        double kl = p * log(p / transition_group_proba[j]);
        klt += kl;
    }

    return klt;
}